

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperFloatingPointComplexEQ<float>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,complex<float> *val1,
          complex<float> *val2)

{
  bool bVar1;
  complex<float> *pcVar2;
  float fVar3;
  bool local_d1;
  string local_d0;
  string local_b0;
  string local_80;
  string local_60;
  floating_point<float> local_40;
  floating_point<float> local_3c;
  floating_point<float> imag2;
  floating_point<float> imag1;
  floating_point<float> real2;
  floating_point<float> real1;
  complex<float> *val2_local;
  complex<float> *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  pcVar2 = val1;
  fVar3 = std::complex<float>::real_abi_cxx11_(val1);
  floating_point<float>::floating_point(&imag1,fVar3);
  fVar3 = std::complex<float>::real_abi_cxx11_(val2);
  floating_point<float>::floating_point(&imag2,fVar3);
  fVar3 = std::complex<float>::imag_abi_cxx11_(val1);
  floating_point<float>::floating_point(&local_3c,fVar3);
  fVar3 = std::complex<float>::imag_abi_cxx11_(val2);
  floating_point<float>::floating_point(&local_40,fVar3);
  bVar1 = floating_point<float>::AlmostEquals(&imag1,&imag2);
  pcVar2 = (complex<float> *)CONCAT71((int7)((ulong)pcVar2 >> 8),bVar1);
  local_d1 = false;
  if (bVar1) {
    local_d1 = floating_point<float>::AlmostEquals(&local_3c,&local_40);
  }
  if (local_d1 == false) {
    FormatForComparisonFailureMessage<std::complex<float>,std::complex<float>>
              (&local_80,(internal *)val1,val2,pcVar2);
    detail::ShowStringQuoted(&local_60,&local_80);
    FormatForComparisonFailureMessage<std::complex<float>,std::complex<float>>
              (&local_d0,(internal *)val2,val1,pcVar2);
    detail::ShowStringQuoted(&local_b0,&local_d0);
    EqFailure(__return_storage_ptr__,expr1,expr2,&local_60,&local_b0,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointComplexEQ(const char* expr1, const char* expr2
                                                , const ::std::complex<RawType>& val1, const ::std::complex<RawType>& val2)
{
    floating_point<RawType> real1(val1.real()), real2(val2.real());
    floating_point<RawType> imag1(val1.imag()), imag2(val2.imag());
    if IUTEST_COND_LIKELY( real1.AlmostEquals(real2) && imag1.AlmostEquals(imag2) )
    {
        return AssertionSuccess();
    }